

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,Vector *hidden)

{
  int *piVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  int *piVar4;
  undefined1 in_ZMM0 [64];
  
  iVar3 = Vector::size(hidden);
  if (iVar3 == this->hsz_) {
    Vector::zero(hidden);
    for (piVar4 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar1 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish, piVar4 != piVar1; piVar4 = piVar4 + 1) {
      Vector::addRow(hidden,(this->wi_).
                            super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)*piVar4);
    }
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                                (long)piVar1 -
                                (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                      .super__Vector_impl_data._M_start >> 2);
    Vector::mul(hidden,(float)(1.0 / auVar2._0_8_));
    return;
  }
  __assert_fail("hidden.size() == hsz_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                ,0x6b,
                "void fasttext::Model::computeHidden(const std::vector<int32_t> &, Vector &) const")
  ;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, Vector& hidden) const {
  assert(hidden.size() == hsz_);
  hidden.zero();
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    hidden.addRow(*wi_, *it);
  }
  hidden.mul(1.0 / input.size());
}